

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O1

bool __thiscall
QSQLiteDriver::isIdentifierEscaped(QSQLiteDriver *this,QString *identifier,IdentifierType type)

{
  char16_t cVar1;
  ulong uVar2;
  char16_t *pcVar3;
  bool bVar4;
  
  uVar2 = (identifier->d).size;
  if (uVar2 < 3) {
    return false;
  }
  pcVar3 = (identifier->d).ptr;
  cVar1 = *pcVar3;
  if (cVar1 == L'`') {
    bVar4 = true;
    if (pcVar3[uVar2 - 1] != L'`') {
      return false;
    }
  }
  else if (cVar1 == L'[') {
    bVar4 = pcVar3[uVar2 - 1] == L']';
  }
  else {
    if (cVar1 != L'\"') {
      return false;
    }
    bVar4 = true;
    if (pcVar3[uVar2 - 1] != L'\"') {
      return false;
    }
  }
  return bVar4;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }